

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O1

void __thiscall DGlow2::Tick(DGlow2 *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  short sVar4;
  int iVar5;
  
  iVar5 = this->m_MaxTics;
  iVar1 = this->m_Tics;
  iVar3 = iVar1 + 1;
  this->m_Tics = iVar3;
  if (iVar5 <= iVar1) {
    iVar1 = this->m_End;
    if (this->m_OneShot == true) {
      iVar3 = 0x7fff;
      if (iVar1 < 0x7fff) {
        iVar3 = iVar1;
      }
      iVar5 = -0x8000;
      if (-0x8000 < iVar3) {
        iVar5 = iVar3;
      }
      ((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel = (short)iVar5;
      (*(this->super_DLighting).super_DSectorEffect.super_DThinker.super_DObject._vptr_DObject[4])()
      ;
      return;
    }
    iVar2 = this->m_Start;
    this->m_Start = iVar1;
    this->m_End = iVar2;
    this->m_Tics = iVar3 - iVar5;
  }
  iVar3 = ((this->m_End - this->m_Start) * this->m_Tics) / iVar5 + this->m_Start;
  if (0x7ffe < iVar3) {
    iVar3 = 0x7fff;
  }
  sVar4 = -0x8000;
  if (-0x8000 < iVar3) {
    sVar4 = (short)iVar3;
  }
  ((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel = sVar4;
  return;
}

Assistant:

void DGlow2::Tick ()
{
	if (m_Tics++ >= m_MaxTics)
	{
		if (m_OneShot)
		{
			m_Sector->SetLightLevel(m_End);
			Destroy ();
			return;
		}
		else
		{
			int temp = m_Start;
			m_Start = m_End;
			m_End = temp;
			m_Tics -= m_MaxTics;
		}
	}

	m_Sector->SetLightLevel(((m_End - m_Start) * m_Tics) / m_MaxTics + m_Start);
}